

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

Half deqp::gls::anon_unknown_1::getRandom<deqp::gls::(anonymous_namespace)::GLValue::Half>
               (deRandom *rnd,Half min,Half max)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fMin;
  float fMax;
  deRandom *rnd_local;
  Half max_local;
  Half min_local;
  Half h;
  
  rnd_local._2_2_ = max.m_value;
  rnd_local._4_2_ = min.m_value;
  bVar1 = GLValue::Half::operator<((Half *)((long)&rnd_local + 2),(Half *)((long)&rnd_local + 4));
  if (bVar1) {
    rnd_local._6_2_ = rnd_local._4_2_;
  }
  else {
    fVar2 = GLValue::Half::to<float>((Half *)((long)&rnd_local + 2));
    fVar3 = GLValue::Half::to<float>((Half *)((long)&rnd_local + 4));
    fVar4 = deRandom_getFloat(rnd);
    rnd_local._6_2_ = GLValue::Half::create(fVar4 * (fVar2 - fVar3) + fVar3);
  }
  return (Half)rnd_local._6_2_;
}

Assistant:

inline GLValue::Half getRandom (deRandom& rnd, GLValue::Half min, GLValue::Half max)
{
	if (max < min)
		return min;

	float fMax = max.to<float>();
	float fMin = min.to<float>();
	GLValue::Half h = GLValue::Half::create(fMin + deRandom_getFloat(&rnd) * (fMax - fMin));
	return h;
}